

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_kwp.c
# Opt level: O2

err_t beltKWPUnwrap(octet *dest,octet *src,size_t count,octet *header,octet *key,size_t len)

{
  size_t count_00;
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  blob_t state;
  void *dest_00;
  err_t eVar4;
  
  eVar4 = 0x6d;
  if ((((0x1f < count) && (len < 0x21)) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) &&
     (bVar1 = memIsValid(src,count), bVar1 != 0)) {
    if ((header != (octet *)0x0) && (bVar1 = memIsValid(header,0x10), bVar1 == 0)) {
      return 0x6d;
    }
    bVar1 = memIsValid(key,len);
    if (bVar1 != 0) {
      count_00 = count - 0x10;
      bVar1 = memIsValid(dest,count_00);
      if (bVar1 != 0) {
        sVar3 = beltWBL_keep();
        state = blobCreate(sVar3 + 0x10);
        if (state == (blob_t)0x0) {
          eVar4 = 0x6e;
        }
        else {
          eVar4 = 0;
          sVar3 = beltWBL_keep();
          dest_00 = (void *)(sVar3 + (long)state);
          beltWBLStart(state,key,len);
          memCopy(dest_00,src + (count - 0x10),0x10);
          memMove(dest,src,count_00);
          beltWBLStepD2(dest,dest_00,count,state);
          if (header == (octet *)0x0) {
            iVar2 = memIsZero(dest_00,0x10);
          }
          else {
            iVar2 = memEq(header,dest_00,0x10);
          }
          if (iVar2 == 0) {
            memSet(dest,'\0',count_00);
            eVar4 = 0x201;
          }
          blobClose(state);
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t beltKWPUnwrap(octet dest[], const octet src[], size_t count,
	const octet header[16], const octet key[], size_t len)
{
	void* state;
	octet* header2;
	// проверить входные данные
	if (count < 32 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsNullOrValid(header, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count - 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKWP_keep() + 16);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	header2 = (octet*)state + beltKWP_keep();
	// снять защиту
	beltKWPStart(state, key, len);
	memCopy(header2, src + count - 16, 16);
	memMove(dest, src, count - 16);
	beltKWPStepD2(dest, header2, count, state);
	if (header && !memEq(header, header2, 16) ||
		header == 0 && !memIsZero(header2, 16))
	{
		memSetZero(dest, count - 16);
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// завершить
	blobClose(state);
	return ERR_OK;
}